

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

bool __thiscall OSToken::deleteObject(OSToken *this,OSObject *object)

{
  Directory *this_00;
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ObjectFile *this_01;
  undefined8 uVar5;
  long in_RSI;
  long in_RDI;
  string lockFilename;
  string objectFilename;
  ObjectFile *fileObject;
  MutexLocker lock;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  Directory *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  Generation *in_stack_ffffffffffffff90;
  _Self local_28;
  _Self local_20;
  long local_18;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_1 = false;
  }
  else {
    local_18 = in_RSI;
    local_20._M_node =
         (_Base_ptr)
         std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::find
                   ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                    CONCAT17(in_stack_ffffffffffffff0f,
                             CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
                    (key_type *)in_stack_ffffffffffffff00);
    local_28._M_node =
         (_Base_ptr)
         std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::end
                   ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                    CONCAT17(in_stack_fffffffffffffeff,
                             CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    bVar1 = std::operator==(&local_20,&local_28);
    if (bVar1) {
      softHSMLog(3,"deleteObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x183,"Cannot delete non-existent object 0x%08X",local_18);
      local_1 = false;
    }
    else {
      MutexLocker::MutexLocker
                ((MutexLocker *)in_stack_ffffffffffffff00,
                 (Mutex *)CONCAT17(in_stack_fffffffffffffeff,
                                   CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
      if (local_18 == 0) {
        this_01 = (ObjectFile *)0x0;
      }
      else {
        this_01 = (ObjectFile *)__dynamic_cast(local_18,&OSObject::typeinfo,&ObjectFile::typeinfo,0)
        ;
      }
      if (this_01 == (ObjectFile *)0x0) {
        softHSMLog(3,"deleteObject",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x18d,"Object type not compatible with this token class 0x%08X",local_18);
        local_1 = false;
      }
      else {
        ObjectFile::invalidate((ObjectFile *)0x1df53f);
        ObjectFile::getFilename_abi_cxx11_(this_01);
        this_00 = *(Directory **)(in_RDI + 0xd0);
        std::__cxx11::string::string(local_90,(string *)&stack0xffffffffffffff90);
        iVar4 = Directory::remove(this_00,(char *)local_90);
        bVar2 = (byte)iVar4 ^ 0xff;
        std::__cxx11::string::~string(local_90);
        if ((bVar2 & 1) == 0) {
          ObjectFile::getLockname_abi_cxx11_(this_01);
          in_stack_ffffffffffffff00 = *(Directory **)(in_RDI + 0xd0);
          std::__cxx11::string::string(local_d0,local_b0);
          iVar4 = Directory::remove(in_stack_ffffffffffffff00,(char *)local_d0);
          bVar2 = (byte)iVar4;
          bVar3 = bVar2 ^ 0xff;
          std::__cxx11::string::~string(local_d0);
          bVar1 = (bVar3 & 1) != 0;
          if (bVar1) {
            uVar5 = std::__cxx11::string::c_str();
            softHSMLog(3,"deleteObject",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x1a6,"Failed to delete lock file %s",uVar5);
          }
          else {
            std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::erase
                      ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                       in_stack_ffffffffffffff00,
                       (key_type *)CONCAT17(bVar2,CONCAT16(bVar3,in_stack_fffffffffffffef8)));
            uVar5 = std::__cxx11::string::c_str();
            softHSMLog(7,"deleteObject",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                       ,0x1ad,"Deleted object %s",uVar5);
            Generation::update(*(Generation **)(in_RDI + 200));
            Generation::commit(in_stack_ffffffffffffff90);
          }
          local_1 = !bVar1;
          std::__cxx11::string::~string(local_b0);
        }
        else {
          uVar5 = std::__cxx11::string::c_str();
          softHSMLog(3,"deleteObject",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x19b,"Failed to delete object file %s",uVar5);
          local_1 = false;
        }
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
      }
      MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffff00);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSToken::deleteObject(OSObject* object)
{
	if (!valid) return false;

	if (objects.find(object) == objects.end())
	{
		ERROR_MSG("Cannot delete non-existent object 0x%08X", object);

		return false;
	}

	MutexLocker lock(tokenMutex);

	ObjectFile* fileObject = dynamic_cast<ObjectFile*>(object);
	if (fileObject == NULL)
	{
		ERROR_MSG("Object type not compatible with this token class 0x%08X", object);

		return false;
	}

	// Invalidate the object instance
	fileObject->invalidate();

	// Retrieve the filename of the object
	std::string objectFilename = fileObject->getFilename();

	// Attempt to delete the file
	if (!tokenDir->remove(objectFilename))
	{
		ERROR_MSG("Failed to delete object file %s", objectFilename.c_str());

		return false;
	}

	// Retrieve the filename of the lock
	std::string lockFilename = fileObject->getLockname();

	// Attempt to delete the lock
	if (!tokenDir->remove(lockFilename))
	{
		ERROR_MSG("Failed to delete lock file %s", lockFilename.c_str());

		return false;
	}

	objects.erase(object);

	DEBUG_MSG("Deleted object %s", objectFilename.c_str());

	gen->update();

	gen->commit();

	return true;
}